

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

char * process_pref_file_expr(char **sp,char *fp)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  void *pvVar6;
  player_class *ppVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  byte *pbVar14;
  char *pcVar15;
  char local_51;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  char **local_38;
  
  local_51 = ' ';
  pbVar14 = (byte *)*sp;
  local_40 = (byte *)fp;
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  do {
    local_48 = pbVar14;
    bVar13 = *local_48;
    uVar12 = (ulong)bVar13;
    uVar1 = puVar2[uVar12];
    pbVar14 = local_48 + 1;
  } while ((uVar1 >> 0xd & 1) != 0);
  pbVar9 = pbVar14;
  local_38 = sp;
  if (bVar13 == 0x5b) {
    local_50 = pbVar14;
    pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
    if (*pcVar5 == '\0') {
      bVar11 = *local_50;
      local_48 = (byte *)0x269807;
    }
    else {
      iVar3 = strcmp(pcVar5,"IOR");
      if (iVar3 == 0) {
        pbVar14 = (byte *)0x26412d;
        while ((bVar11 = *local_50, local_48 = pbVar14, bVar11 != 0 && (local_51 != ']'))) {
          pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
          if (*pcVar5 != '\0') {
            if (*pcVar5 == '0') {
              if (pcVar5[1] != '\0') {
                pbVar14 = (byte *)0x26c6a0;
              }
            }
            else {
              pbVar14 = (byte *)0x26c6a0;
            }
          }
        }
      }
      else {
        iVar3 = strcmp(pcVar5,"AND");
        if (iVar3 == 0) {
          pbVar14 = (byte *)0x26c6a0;
          while ((bVar11 = *local_50, local_48 = pbVar14, bVar11 != 0 && (local_51 != ']'))) {
            pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
            if ((*pcVar5 == '0') && (pcVar5[1] == '\0')) {
              pbVar14 = (byte *)0x26412d;
            }
          }
        }
        else {
          iVar3 = strcmp(pcVar5,"NOT");
          if (iVar3 == 0) {
            pbVar14 = (byte *)0x26c6a0;
            while ((bVar11 = *local_50, local_48 = pbVar14, bVar11 != 0 && (local_51 != ']'))) {
              pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
              if (*pcVar5 != '\0') {
                if (*pcVar5 == '0') {
                  if (pcVar5[1] != '\0') {
                    pbVar14 = (byte *)0x26412d;
                  }
                }
                else {
                  pbVar14 = (byte *)0x26412d;
                }
              }
            }
          }
          else {
            iVar3 = strcmp(pcVar5,"EQU");
            if (iVar3 == 0) {
              if ((*local_50 != 0) && (local_51 != ']')) {
                pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
              }
              local_48 = (byte *)0x26c6a0;
              while ((pcVar15 = pcVar5, bVar11 = *local_50, sp = local_38, bVar11 != 0 &&
                     (local_51 != ']'))) {
                pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
                if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar15,pcVar5), iVar3 != 0)) {
                  local_48 = (byte *)0x26412d;
                }
              }
            }
            else {
              iVar3 = strcmp(pcVar5,"LEQ");
              if (iVar3 == 0) {
                if ((*local_50 != 0) && (local_51 != ']')) {
                  pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
                }
                local_48 = (byte *)0x26c6a0;
                while ((pcVar15 = pcVar5, bVar11 = *local_50, sp = local_38, bVar11 != 0 &&
                       (local_51 != ']'))) {
                  pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
                  if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar15,pcVar5), -1 < iVar3)) {
                    local_48 = (byte *)0x26412d;
                  }
                }
              }
              else {
                iVar3 = strcmp(pcVar5,"GEQ");
                if (iVar3 == 0) {
                  if ((*local_50 != 0) && (local_51 != ']')) {
                    pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
                  }
                  local_48 = (byte *)0x26c6a0;
                  while ((pcVar15 = pcVar5, bVar11 = *local_50, sp = local_38, bVar11 != 0 &&
                         (local_51 != ']'))) {
                    pcVar5 = process_pref_file_expr((char **)&local_50,&local_51);
                    if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar15,pcVar5), iVar3 < 1)) {
                      local_48 = (byte *)0x26412d;
                    }
                  }
                }
                else {
                  while ((bVar11 = *local_50, local_48 = (byte *)"?o?o?", bVar11 != 0 &&
                         (local_51 != ']'))) {
                    process_pref_file_expr((char **)&local_50,&local_51);
                  }
                }
              }
            }
          }
        }
      }
    }
    pbVar8 = (byte *)"?x?x?";
    if (local_51 == ']') {
      pbVar8 = local_48;
    }
    pbVar9 = local_40;
    if (bVar11 == 0) {
      bVar11 = 0;
      pbVar10 = local_50;
    }
    else {
      *local_50 = 0;
      pbVar10 = local_50 + 1;
    }
  }
  else {
    while ((bVar11 = (byte)uVar12, (uVar1 >> 0xe & 1) != 0 &&
           (pvVar6 = memchr(" []",(int)(char)bVar11,4), pvVar6 == (void *)0x0))) {
      uVar12 = (ulong)*pbVar9;
      uVar1 = puVar2[uVar12];
      pbVar9 = pbVar9 + 1;
    }
    sp = local_38;
    pbVar10 = pbVar9 + -1;
    if (bVar11 != 0) {
      *pbVar10 = 0;
      bVar13 = *local_48;
      pbVar10 = pbVar9;
    }
    pbVar8 = local_48;
    pbVar9 = local_40;
    if ((bVar13 == 0x24) &&
       (iVar3 = strcmp((char *)pbVar14,"SYS"), pbVar9 = local_40, pbVar8 = (byte *)ANGBAND_SYS,
       iVar3 != 0)) {
      iVar3 = strcmp((char *)pbVar14,"RACE");
      if (iVar3 == 0) {
        ppVar7 = (player_class *)player->race;
      }
      else {
        iVar3 = strcmp((char *)pbVar14,"CLASS");
        if (iVar3 != 0) {
          pbVar8 = (byte *)"?o?o?";
          goto LAB_001db0b1;
        }
        ppVar7 = player->class;
      }
      pbVar8 = (byte *)ppVar7->name;
    }
  }
LAB_001db0b1:
  *pbVar9 = bVar11;
  *sp = (char *)pbVar10;
  return (char *)pbVar8;
}

Assistant:

static const char *process_pref_file_expr(char **sp, char *fp)
{
	const char *v;

	char *b;
	char *s;

	char f = ' ';

	/* Initial */
	s = (*sp);

	/* Skip spaces */
	while (isspace((unsigned char)*s)) s++;

	/* Save start */
	b = s;

	/* Default */
	v = "?o?o?";

	/* Either the string starts with a [ or it doesn't */
	if (*s == '[') {
		const char *p;
		const char *t;

		/* Skip [ */
		s++;

		/* First */
		t = process_pref_file_expr(&s, &f);

		/* Check all the different types of connective */
		if (!*t) {
			/* Nothing */
		} else if (streq(t, "IOR")) {
			v = "0";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "1";
			}
		} else if (streq(t, "AND")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && streq(t, "0")) v = "0";
			}
		} else if (streq(t, "NOT")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "0";
			}
		} else if (streq(t, "EQU")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(p, t)) v = "0";
			}
		} else if (streq(t, "LEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) >= 0)) v = "0";
			}
		} else if (streq(t, "GEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) <= 0)) v = "0";
			}
		} else {
			while (*s && (f != ']')) {
				(void) process_pref_file_expr(&s, &f);
			}
		}

		/* Verify ending */
		if (f != ']') v = "?x?x?";

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';
	} else {
		/* Accept all printables except spaces and brackets */
		while (isprint((unsigned char)*s) && !strchr(" []", *s)) ++s;

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';

		/* Variables start with $, otherwise it's a constant */
		if (*b == '$') {
			if (streq(b+1, "SYS"))
				v = ANGBAND_SYS;
			else if (streq(b+1, "RACE"))
				v = player->race->name;
			else if (streq(b+1, "CLASS"))
				v = player->class->name;
		} else {
			v = b;
		}
	}

	/* Save */
	(*fp) = f;
	(*sp) = s;

	return v;
}